

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_> * __thiscall
chaiscript::AST_Node_Trace::get_children
          (vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
           *__return_storage_ptr__,AST_Node_Trace *this,AST_Node *node)

{
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  node_children;
  allocator_type local_29;
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  local_28;
  
  (**node->_vptr_AST_Node)(&local_28,node);
  std::vector<chaiscript::AST_Node_Trace,std::allocator<chaiscript::AST_Node_Trace>>::
  vector<__gnu_cxx::__normal_iterator<std::reference_wrapper<chaiscript::AST_Node>const*,std::vector<std::reference_wrapper<chaiscript::AST_Node>,std::allocator<std::reference_wrapper<chaiscript::AST_Node>>>>,void>
            ((vector<chaiscript::AST_Node_Trace,std::allocator<chaiscript::AST_Node_Trace>> *)
             __return_storage_ptr__,
             (__normal_iterator<const_std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
              )local_28._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
              )local_28._M_impl.super__Vector_impl_data._M_finish,&local_29);
  std::
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AST_Node_Trace> get_children(const AST_Node &node) {
      const auto node_children = node.get_children();
      return std::vector<AST_Node_Trace>(node_children.begin(), node_children.end());
    }